

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O1

mk_vhost_handler *
mk_vhost_handler_match(char *match,_func_void_mk_http_request_ptr_void_ptr *cb,void *data)

{
  mk_vhost_handler *__ptr;
  void *__dest;
  char *pcVar1;
  re_t __src;
  
  __ptr = (mk_vhost_handler *)malloc(0x50);
  if (__ptr == (mk_vhost_handler *)0x0) {
    perror("malloc");
  }
  if (__ptr != (mk_vhost_handler *)0x0) {
    __ptr->name = (char *)0x0;
    __ptr->cb = cb;
    __ptr->data = data;
    __dest = malloc(0x2000);
    if (__dest == (void *)0x0) {
      perror("malloc");
    }
    __ptr->match = __dest;
    if (__dest != (void *)0x0) {
      (__ptr->params).next = &__ptr->params;
      (__ptr->params).prev = &__ptr->params;
      pcVar1 = match;
      do {
        if (*pcVar1 == ' ') {
          *pcVar1 = '|';
        }
        else if (*pcVar1 == '\0') {
          __src = re_compile(match);
          memcpy(__dest,__src,0x2000);
          return __ptr;
        }
        pcVar1 = pcVar1 + 1;
      } while( true );
    }
    free(__ptr);
  }
  return (mk_vhost_handler *)0x0;
}

Assistant:

struct mk_vhost_handler *mk_vhost_handler_match(char *match,
                                                void (*cb)(struct mk_http_request *,
                                                           void *),
                                                void *data)
{
    int ret;
    struct mk_vhost_handler *h;

    h = mk_mem_alloc(sizeof(struct mk_vhost_handler));
    if (!h) {
        return NULL;
    }
    h->name  = NULL;
    h->cb    = cb;
    h->data  = data;
    h->match = mk_mem_alloc(REGEXP_SIZE);
    if (!h->match) {
        mk_mem_free(h);
        return NULL;
    }
    mk_list_init(&h->params);

    ret = str_to_regex(match, h->match);
    if (ret == -1) {
        mk_mem_free(h);
        return NULL;
    }

    return h;
}